

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::StringTrieBuilder::LinearMatchNode::operator==(LinearMatchNode *this,Node *other)

{
  UBool UVar1;
  bool bVar2;
  
  if (this != (LinearMatchNode *)other) {
    UVar1 = ValueNode::operator==(&this->super_ValueNode,other);
    if ((UVar1 == '\0') || (this->length != other[1].hash)) {
      bVar2 = false;
    }
    else {
      bVar2 = this->next == (Node *)other[2].super_UObject._vptr_UObject;
    }
    return bVar2;
  }
  return '\x01';
}

Assistant:

UBool
StringTrieBuilder::LinearMatchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!ValueNode::operator==(other)) {
        return FALSE;
    }
    const LinearMatchNode &o=(const LinearMatchNode &)other;
    return length==o.length && next==o.next;
}